

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall World::~World(World *this)

{
  World *this_00;
  
  this_00 = (World *)(&(this->super_Entity).field_0x0 +
                     *(long *)(*(long *)&this->super_Entity + -0x18));
  ~World(this_00,&VTT);
  operator_delete(this_00);
  return;
}

Assistant:

World::~World() {
    delete activeTet;
    activeTet = nullptr;
    
    delete nextTet;
    nextTet = nullptr;
    
    delete heap;
    heap = nullptr;
    
    delete spawnPoint;
    spawnPoint = nullptr;
    
    delete bounds;
    bounds = nullptr;
    
    delete typeFactory;
    typeFactory = nullptr;
    
    delete tetFactory;
    tetFactory = nullptr;
}